

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O1

double * multinomial_covariance(int a,int b,double *c)

{
  double *pdVar1;
  ulong uVar2;
  ulong uVar3;
  double *pdVar4;
  double *pdVar5;
  ulong uVar6;
  double dVar7;
  
  pdVar1 = (double *)operator_new__((ulong)(uint)(b * b) << 3);
  if (0 < b) {
    uVar2 = (ulong)(uint)b;
    uVar3 = 0;
    pdVar4 = pdVar1;
    do {
      uVar6 = 0;
      pdVar5 = pdVar4;
      do {
        if (uVar3 == uVar6) {
          dVar7 = c[uVar3] * (double)a * (1.0 - c[uVar3]);
        }
        else {
          dVar7 = c[uVar3] * -(double)a * c[uVar6];
        }
        *pdVar5 = dVar7;
        uVar6 = uVar6 + 1;
        pdVar5 = pdVar5 + uVar2;
      } while (uVar2 != uVar6);
      uVar3 = uVar3 + 1;
      pdVar4 = pdVar4 + 1;
    } while (uVar3 != uVar2);
  }
  return pdVar1;
}

Assistant:

double *multinomial_covariance ( int a, int b, double c[] )

//****************************************************************************80
//
//  Purpose:
//
//    MULTINOMIAL_COVARIANCE returns the covariances of the Multinomial PDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    14 February 1999
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int A, the number of trials.
//
//    Input, int B, the number of outcomes possible on one trial.
//    1 <= B.
//
//    Input, double C(B).  C(I) is the probability of outcome I on
//    any trial.
//    0.0 <= C(I) <= 1.0,
//    SUM ( 1 <= I <= B) C(I) = 1.0.
//
//    Output, double MULTINOMIAL_COVARIANCE[B*B], the covariance matrix.
//
{
  double *covariance;
  int i;
  int j;

  covariance = new double[b*b];

  for ( i = 0; i < b; i++)
  {
    for ( j = 0; j < b; j++ )
    {
      if ( i == j )
      {
        covariance[i+j*b] = static_cast<double>(a ) * c[i] * ( 1.0 - c[i] );
      }
      else
      {
        covariance[i+j*b] = - static_cast<double>(a ) * c[i] * c[j];
      }
    }
  }

  return covariance;
}